

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::rangeToString<char8_t_const*,char8_t_const*>
          (string *__return_storage_ptr__,Detail *this,char8_t *first,char8_t *last)

{
  string *psVar1;
  Detail *pDVar2;
  ReusableStringStream rss;
  long *local_70;
  long local_68;
  long local_60 [2];
  ReusableStringStream local_50;
  string *local_38;
  
  ReusableStringStream::ReusableStringStream(&local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_50.m_oss,"{ ",2);
  local_38 = __return_storage_ptr__;
  if (this != (Detail *)first) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,unprintableString_abi_cxx11_,
               DAT_001d7c80 + unprintableString_abi_cxx11_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,(char *)local_70,local_68);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    pDVar2 = this + 1;
    if (pDVar2 != (Detail *)first) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_50.m_oss,", ",2);
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,unprintableString_abi_cxx11_,
                   DAT_001d7c80 + unprintableString_abi_cxx11_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_50.m_oss,(char *)local_70,local_68);
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        pDVar2 = pDVar2 + 1;
      } while (pDVar2 != (Detail *)first);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_50.m_oss," }",2);
  psVar1 = local_38;
  ReusableStringStream::str_abi_cxx11_((string *)local_38,&local_50);
  ReusableStringStream::~ReusableStringStream(&local_50);
  return psVar1;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }